

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O0

int Ree_ManCountFadds(Vec_Int_t *vAdds)

{
  int iVar1;
  undefined4 local_18;
  undefined4 local_14;
  int Count;
  int i;
  Vec_Int_t *vAdds_local;
  
  local_18 = 0;
  local_14 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vAdds);
    if (iVar1 <= local_14 * 6) break;
    iVar1 = Vec_IntEntry(vAdds,local_14 * 6 + 2);
    if (iVar1 != 0) {
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  }
  return local_18;
}

Assistant:

int Ree_ManCountFadds( Vec_Int_t * vAdds )
{
    int i, Count = 0;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
        if ( Vec_IntEntry(vAdds, 6*i+2) != 0 )
            Count++;
    return Count;
}